

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O1

Image __thiscall
Renderer::render(Renderer *this,offset_in_Renderer_to_subr func,bool reportProgress)

{
  Image IVar1;
  _Manager_type p_Var2;
  undefined4 in_ECX;
  _func_void__Any_data_ptr_int_ptr_int_ptr *__tmp_1;
  undefined7 in_register_00000011;
  ulong uVar3;
  int iVar4;
  Image film;
  type gfunc;
  TaskScheduler tasks;
  _Any_data local_f8;
  _Manager_type local_e8;
  _Invoker_type p_Stack_e0;
  undefined4 local_d4;
  void *local_d0;
  int local_c8;
  int iStack_c4;
  offset_in_Renderer_to_subr local_c0;
  undefined8 local_b8;
  Renderer *local_b0;
  TaskScheduler local_a8;
  
  local_c8 = this->camera->resx;
  iStack_c4 = this->camera->resy;
  uVar3 = 0xffffffffffffffff;
  if (-1 < iStack_c4 * local_c8) {
    uVar3 = (long)(iStack_c4 * local_c8 * 3) << 2;
  }
  local_d4 = in_ECX;
  local_d0 = operator_new__(uVar3);
  local_a8.tasks.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_a8.tasks.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_a8.tasks.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_a8.tasks.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_a8.tasks.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_a8.tasks.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_a8.tasks.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_a8.tasks.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_a8.tasks.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8.tasks.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  iVar4 = 0;
  local_c0 = func;
  local_b8 = CONCAT71(in_register_00000011,reportProgress);
  local_b0 = this;
  std::_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_initialize_map((_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *
                    )&local_a8,0);
  local_a8.onprogress.super__Function_base._M_manager = (_Manager_type)0x0;
  local_a8.onprogress._M_invoker = (_Invoker_type)0x0;
  local_a8.onprogress.super__Function_base._M_functor._M_unused._M_object = (int *)0x0;
  local_a8.onprogress.super__Function_base._M_functor._8_8_ = 0;
  if (0 < this->camera->resy) {
    do {
      local_e8 = (_Manager_type)0x0;
      p_Stack_e0 = (_Invoker_type)0x0;
      local_f8._M_unused._M_object = (void *)0x0;
      local_f8._8_8_ = 0;
      local_f8._M_unused._M_object = operator_new(0x20);
      *(int *)local_f8._M_unused._0_8_ = iVar4;
      *(Renderer **)((long)local_f8._M_unused._0_8_ + 8) = this;
      *(void ***)((long)local_f8._M_unused._0_8_ + 0x10) = &local_d0;
      *(offset_in_Renderer_to_subr **)((long)local_f8._M_unused._0_8_ + 0x18) = &local_c0;
      p_Stack_e0 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]toyray/src/renderer.cpp:13:13)>
                   ::_M_invoke;
      local_e8 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]toyray/src/renderer.cpp:13:13)>
                 ::_M_manager;
      std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
                ((deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
                 &local_a8,(value_type *)&local_f8);
      if (local_e8 != (_Manager_type)0x0) {
        (*local_e8)(&local_f8,&local_f8,__destroy_functor);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < this->camera->resy);
  }
  p_Var2 = local_a8.onprogress.super__Function_base._M_manager;
  if ((char)local_d4 != '\0') {
    local_f8._M_unused._M_object =
         local_a8.onprogress.super__Function_base._M_functor._M_unused._M_object;
    local_f8._8_8_ = local_a8.onprogress.super__Function_base._M_functor._8_8_;
    local_a8.onprogress.super__Function_base._M_functor._M_unused._M_object = (int *)0x0;
    local_a8.onprogress.super__Function_base._M_functor._8_8_ = 0;
    local_e8 = local_a8.onprogress.super__Function_base._M_manager;
    local_a8.onprogress.super__Function_base._M_manager =
         std::
         _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]toyray/src/renderer.cpp:22:22)>
         ::_M_manager;
    p_Stack_e0 = local_a8.onprogress._M_invoker;
    local_a8.onprogress._M_invoker =
         std::
         _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]toyray/src/renderer.cpp:22:22)>
         ::_M_invoke;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)(&local_f8,&local_f8,__destroy_functor);
    }
  }
  TaskScheduler::start(&local_a8);
  if ((char)local_d4 != '\0') {
    fputc(10,_stderr);
  }
  if (local_a8.onprogress.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a8.onprogress.super__Function_base._M_manager)
              ((_Any_data *)&local_a8.onprogress,(_Any_data *)&local_a8.onprogress,__destroy_functor
              );
  }
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~deque
            ((deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)&local_a8);
  IVar1.w = local_c8;
  IVar1.pixels = (float *)local_d0;
  IVar1.h = iStack_c4;
  return IVar1;
}

Assistant:

Image Renderer::render(decltype(&Renderer::radiance) func, bool reportProgress) {
	Image film(camera->resx, camera->resy);
	auto gfunc = std::bind(func, this, std::placeholders::_1, std::placeholders::_2);
	TaskScheduler tasks;
	for (int y=0; y<camera->resy; ++y) {
		tasks.add([&,y](){
			for (int x=0; x<camera->resx; ++x) {
				vec2f pixelsize = vec2f(1.0/camera->resx, 1.0/camera->resy);
				vec2f pixelpos = vec2f(x,y) * pixelsize;
				film.setPixel(x, y, renderPixel(gfunc, pixelpos, pixelsize));
			}
		});
	}
	if (reportProgress) {
		tasks.onprogress = [](int k, int n){
			fprintf(stderr, "\r    %.1f%% ", 100.0f*k/n);
		};
	}
	tasks.start();
	if (reportProgress) {
		fprintf(stderr, "\n"); // new line after progress
	}
	return film;
}